

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stun_msg.c
# Opt level: O0

char * stun_class_name(uint16_t type)

{
  char *pcStack_10;
  uint16_t type_local;
  
  if ((type & 0x110) == 0) {
    pcStack_10 = "Request";
  }
  else if ((type & 0x110) == 0x100) {
    pcStack_10 = "Success Response";
  }
  else if ((type & 0x110) == 0x110) {
    pcStack_10 = "Error Response";
  }
  else if ((type & 0x110) == 0x10) {
    pcStack_10 = "Indication";
  }
  else {
    pcStack_10 = "???";
  }
  return pcStack_10;
}

Assistant:

const char *stun_class_name(uint16_t type)
{
  if (STUN_IS_REQUEST(type))
    return "Request";
  else if (STUN_IS_SUCCESS_RESPONSE(type))
    return "Success Response";
  else if (STUN_IS_ERROR_RESPONSE(type))
    return "Error Response";
  else if (STUN_IS_INDICATION(type))
    return "Indication";
  else
    return "???";
}